

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ReporterConfig::ReporterConfig(ReporterConfig *this,IConfigPtr *_fullConfig,ostream *_stream)

{
  ostream *_stream_local;
  IConfigPtr *_fullConfig_local;
  ReporterConfig *this_local;
  
  this->m_stream = _stream;
  clara::std::shared_ptr<const_Catch::IConfig>::shared_ptr(&this->m_fullConfig,_fullConfig);
  return;
}

Assistant:

ReporterConfig::ReporterConfig( IConfigPtr const& _fullConfig, std::ostream& _stream )
    :   m_stream( &_stream ), m_fullConfig( _fullConfig ) {}